

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall asmjit::Assembler::sync(Assembler *this)

{
  SectionEntry *pSVar1;
  int line;
  ulong uVar2;
  char *msg;
  
  if ((this->super_CodeEmitter)._code == (CodeHolder *)0x0) {
    msg = "_code != nullptr";
    line = 0x6f;
  }
  else {
    pSVar1 = this->_section;
    if (pSVar1 == (SectionEntry *)0x0) {
      msg = "_section != nullptr";
      line = 0x70;
    }
    else {
      if (this->_bufferData == (pSVar1->_buffer)._data) {
        uVar2 = (long)this->_bufferPtr - (long)this->_bufferData;
        if ((pSVar1->_buffer)._length < uVar2) {
          (pSVar1->_buffer)._length = uVar2;
        }
        return;
      }
      msg = "_bufferData == _section->_buffer._data";
      line = 0x71;
    }
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/assembler.cpp"
             ,line,msg);
}

Assistant:

void Assembler::sync() noexcept {
  ASMJIT_ASSERT(_code != nullptr);                       // Only called by CodeHolder, so we must be attached.
  ASMJIT_ASSERT(_section != nullptr);                    // One section must always be active, no matter what.
  ASMJIT_ASSERT(_bufferData == _section->_buffer._data); // `_bufferStart` is a shortcut to `_section->buffer.data`.

  // Update only if the current offset is greater than the section length.
  size_t offset = (size_t)(_bufferPtr - _bufferData);
  if (_section->getBuffer().getLength() < offset)
    _section->_buffer._length = offset;
}